

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

bool embree::avx::InstanceIntersector1::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Instance *pIVar4;
  AffineSpace3ff *pAVar5;
  RTCPointQueryContext *pRVar6;
  bool bVar7;
  undefined1 uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  undefined4 uVar12;
  float fVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar19;
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  float fVar22;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar37;
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar42;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 local_128;
  undefined4 local_120;
  float local_11c;
  float local_118;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_98;
  long local_88;
  undefined8 local_80;
  PointQuery *local_78;
  undefined4 local_70;
  undefined1 local_68 [16];
  float local_58;
  void *local_50;
  undefined8 local_48;
  undefined1 local_38 [16];
  
  pIVar4 = prim->instance;
  pAVar5 = pIVar4->local2world;
  if ((pIVar4->super_Geometry).field_8.field_0x1 == '\x01') {
    fVar14 = (pAVar5->p).field_0.m128[3];
    fVar22 = (pAVar5->l).vx.field_0.m128[3];
    fVar26 = (pAVar5->l).vy.field_0.m128[3];
    fVar27 = (pAVar5->l).vz.field_0.m128[3];
    fVar17 = fVar22 * fVar26 + fVar14 * fVar27;
    fVar21 = fVar22 * fVar26 - fVar14 * fVar27;
    fVar28 = fVar14 * fVar14 - fVar22 * fVar22;
    fVar41 = fVar22 * fVar27 - fVar14 * fVar26;
    fVar19 = fVar22 * fVar27 + fVar14 * fVar26;
    fVar20 = fVar26 * fVar27 + fVar14 * fVar22;
    fVar43 = fVar26 * fVar27 - fVar14 * fVar22;
    auVar32 = ZEXT416((uint)(-fVar27 * fVar27 + -fVar26 * fVar26 + fVar14 * fVar14 + fVar22 * fVar22
                            ));
    auVar32 = vshufps_avx(auVar32,auVar32,0);
    auVar29 = ZEXT416((uint)(fVar17 + fVar17));
    auVar29 = vshufps_avx(auVar29,auVar29,0);
    auVar13 = ZEXT416((uint)(fVar41 + fVar41));
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    fVar41 = auVar32._0_4_ * 1.0 + auVar13._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
    fVar44 = auVar32._4_4_ * 0.0 + auVar13._4_4_ * 0.0 + auVar29._4_4_ * 1.0;
    fVar45 = auVar32._8_4_ * 0.0 + auVar13._8_4_ * 1.0 + auVar29._8_4_ * 0.0;
    fVar30 = auVar32._12_4_ * 0.0 + auVar13._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
    auVar32 = ZEXT416((uint)(-fVar27 * fVar27 + fVar26 * fVar26 + fVar28));
    auVar32 = vshufps_avx(auVar32,auVar32,0);
    auVar29 = ZEXT416((uint)(fVar20 + fVar20));
    auVar29 = vshufps_avx(auVar29,auVar29,0);
    auVar13 = ZEXT416((uint)(fVar21 + fVar21));
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    fVar21 = auVar13._0_4_ * 1.0 + auVar32._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
    fVar33 = auVar13._4_4_ * 0.0 + auVar32._4_4_ * 1.0 + auVar29._4_4_ * 0.0;
    fVar34 = auVar13._8_4_ * 0.0 + auVar32._8_4_ * 0.0 + auVar29._8_4_ * 1.0;
    fVar35 = auVar13._12_4_ * 0.0 + auVar32._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
    auVar32 = ZEXT416((uint)(fVar27 * fVar27 + -fVar26 * fVar26 + fVar28));
    auVar29 = vshufps_avx(auVar32,auVar32,0);
    auVar32 = vshufps_avx((undefined1  [16])(pAVar5->l).vx.field_0,ZEXT416(0) << 0x20,0xe9);
    auVar32 = vblendps_avx(auVar32,(undefined1  [16])(pAVar5->l).vy.field_0,4);
    auVar13 = ZEXT416((uint)(fVar43 + fVar43));
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    auVar15 = ZEXT416((uint)(fVar19 + fVar19));
    auVar15 = vshufps_avx(auVar15,auVar15,0);
    fVar28 = auVar15._0_4_ * 1.0 + auVar13._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
    fVar43 = auVar15._4_4_ * 0.0 + auVar13._4_4_ * 1.0 + auVar29._4_4_ * 0.0;
    fVar36 = auVar15._8_4_ * 0.0 + auVar13._8_4_ * 0.0 + auVar29._8_4_ * 1.0;
    fVar38 = auVar15._12_4_ * 0.0 + auVar13._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
    fVar14 = (pAVar5->l).vx.field_0.m128[0];
    aVar42._0_4_ = fVar14 * fVar41 + fVar21 * 0.0 + fVar28 * 0.0;
    aVar42._4_4_ = fVar14 * fVar44 + fVar33 * 0.0 + fVar43 * 0.0;
    aVar42._8_4_ = fVar14 * fVar45 + fVar34 * 0.0 + fVar36 * 0.0;
    aVar42._12_4_ = fVar14 * fVar30 + fVar35 * 0.0 + fVar38 * 0.0;
    fVar14 = (pAVar5->l).vy.field_0.m128[0];
    fVar22 = (pAVar5->l).vy.field_0.m128[1];
    aVar37._0_4_ = fVar14 * fVar41 + fVar22 * fVar21 + fVar28 * 0.0;
    aVar37._4_4_ = fVar14 * fVar44 + fVar22 * fVar33 + fVar43 * 0.0;
    aVar37._8_4_ = fVar14 * fVar45 + fVar22 * fVar34 + fVar36 * 0.0;
    aVar37._12_4_ = fVar14 * fVar30 + fVar22 * fVar35 + fVar38 * 0.0;
    fVar14 = (pAVar5->l).vz.field_0.m128[1];
    fVar22 = (pAVar5->l).vz.field_0.m128[2];
    fVar26 = (pAVar5->l).vz.field_0.m128[0];
    fVar27 = fVar26 * fVar41 + fVar14 * fVar21 + fVar22 * fVar28;
    fVar17 = fVar26 * fVar44 + fVar14 * fVar33 + fVar22 * fVar43;
    fVar19 = fVar26 * fVar45 + fVar14 * fVar34 + fVar22 * fVar36;
    fVar20 = fVar26 * fVar30 + fVar14 * fVar35 + fVar22 * fVar38;
    fVar14 = (pAVar5->p).field_0.m128[2];
    fVar22 = (pAVar5->p).field_0.m128[1];
    fVar26 = (pAVar5->p).field_0.m128[0];
    fVar21 = auVar32._0_4_ + 0.0 + fVar26 * fVar41 + fVar22 * fVar21 + fVar14 * fVar28;
    fVar28 = auVar32._4_4_ + 0.0 + fVar26 * fVar44 + fVar22 * fVar33 + fVar14 * fVar43;
    fVar41 = auVar32._8_4_ + 0.0 + fVar26 * fVar45 + fVar22 * fVar34 + fVar14 * fVar36;
    fVar14 = auVar32._12_4_ + 0.0 + fVar26 * fVar30 + fVar22 * fVar35 + fVar14 * fVar38;
  }
  else {
    aVar42 = (pAVar5->l).vx.field_0;
    aVar37 = (pAVar5->l).vy.field_0;
    fVar27 = (pAVar5->l).vz.field_0.m128[0];
    fVar17 = (pAVar5->l).vz.field_0.m128[1];
    fVar19 = (pAVar5->l).vz.field_0.m128[2];
    fVar20 = (pAVar5->l).vz.field_0.m128[3];
    fVar21 = (pAVar5->p).field_0.m128[0];
    fVar28 = (pAVar5->p).field_0.m128[1];
    fVar41 = (pAVar5->p).field_0.m128[2];
    fVar14 = (pAVar5->p).field_0.m128[3];
  }
  auVar32 = *(undefined1 (*) [16])(pIVar4->world2local0).l.vx.field_0.m128;
  auVar29 = *(undefined1 (*) [16])(pIVar4->world2local0).l.vy.field_0.m128;
  auVar13 = *(undefined1 (*) [16])(pIVar4->world2local0).l.vz.field_0.m128;
  fVar22 = (pIVar4->world2local0).p.field_0.m128[0];
  fVar26 = (pIVar4->world2local0).p.field_0.m128[1];
  fVar43 = (pIVar4->world2local0).p.field_0.m128[2];
  fVar44 = (pIVar4->world2local0).p.field_0.m128[3];
  uVar12 = 2;
  bVar7 = true;
  local_58 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar15 = vdpps_avx(auVar32,auVar29,0x7f);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx(auVar15,auVar18);
    if (auVar15._0_4_ <= 1e-05) {
      auVar15 = vdpps_avx(auVar32,auVar13,0x7f);
      auVar15 = vandps_avx(auVar15,auVar18);
      if (auVar15._0_4_ <= 1e-05) {
        auVar15 = vdpps_avx(auVar29,auVar13,0x7f);
        auVar15 = vandps_avx(auVar15,auVar18);
        if (auVar15._0_4_ <= 1e-05) {
          auVar16 = vdpps_avx(auVar32,auVar32,0x7f);
          auVar23 = vdpps_avx(auVar29,auVar29,0x7f);
          fVar45 = auVar16._0_4_;
          auVar15 = vandps_avx(ZEXT416((uint)(fVar45 - auVar23._0_4_)),auVar18);
          if (auVar15._0_4_ <= 1e-05) {
            auVar24 = vdpps_avx(auVar13,auVar13,0x7f);
            auVar15 = vandps_avx(ZEXT416((uint)(fVar45 - auVar24._0_4_)),auVar18);
            if ((auVar15._0_4_ <= 1e-05) &&
               (auVar15 = vandps_avx(ZEXT416((uint)(auVar23._0_4_ - auVar24._0_4_)),auVar18),
               auVar15._0_4_ <= 1e-05)) {
              uVar12 = 1;
              if (fVar45 < 0.0) {
                local_108 = fVar22;
                fStack_104 = fVar26;
                fStack_100 = fVar43;
                fStack_fc = fVar44;
                local_f8 = auVar13;
                local_e8 = auVar29;
                local_d8 = auVar32;
                local_c8 = fVar21;
                fStack_c4 = fVar28;
                fStack_c0 = fVar41;
                fStack_bc = fVar14;
                local_b8 = fVar27;
                fStack_b4 = fVar17;
                fStack_b0 = fVar19;
                fStack_ac = fVar20;
                local_a8 = aVar37;
                local_98 = aVar42;
                local_58 = sqrtf(fVar45);
                auVar13 = local_f8;
                aVar37 = local_a8;
                aVar42 = local_98;
                auVar32 = local_d8;
                auVar29 = local_e8;
                fVar27 = local_b8;
                fVar17 = fStack_b4;
                fVar19 = fStack_b0;
                fVar20 = fStack_ac;
                fVar21 = local_c8;
                fVar28 = fStack_c4;
                fVar41 = fStack_c0;
                fVar14 = fStack_bc;
                fVar22 = local_108;
                fVar26 = fStack_104;
                fVar43 = fStack_100;
                fVar44 = fStack_fc;
              }
              else {
                auVar15 = vsqrtss_avx(auVar16,auVar16);
                local_58 = auVar15._0_4_;
              }
              bVar7 = false;
            }
          }
        }
      }
    }
  }
  pRVar6 = context->userContext;
  uVar10 = pRVar6->instStackSize;
  pRVar6->instID[uVar10] = prim->instID_;
  pRVar6->instPrimID[uVar10] = 0;
  *(undefined1 (*) [16])pRVar6->world2inst[uVar10] = auVar32;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar10] + 4) = auVar29;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar10] + 8) = auVar13;
  pfVar1 = pRVar6->world2inst[uVar10] + 0xc;
  *pfVar1 = fVar22;
  pfVar1[1] = fVar26;
  pfVar1[2] = fVar43;
  pfVar1[3] = fVar44;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)pRVar6->inst2world[uVar10] = aVar42;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar6->inst2world[uVar10] + 4) = aVar37;
  pfVar1 = pRVar6->inst2world[uVar10] + 8;
  *pfVar1 = fVar27;
  pfVar1[1] = fVar17;
  pfVar1[2] = fVar19;
  pfVar1[3] = fVar20;
  pfVar1 = pRVar6->inst2world[uVar10] + 0xc;
  *pfVar1 = fVar21;
  pfVar1[1] = fVar28;
  pfVar1[2] = fVar41;
  pfVar1[3] = fVar14;
  pRVar6->instStackSize = pRVar6->instStackSize + 1;
  local_11c = query->time;
  fVar14 = (query->p).field_0.field_0.x;
  fVar27 = (query->p).field_0.field_0.y;
  fVar17 = (query->p).field_0.field_0.z;
  auVar15._0_4_ = auVar32._0_4_ * fVar14 + auVar29._0_4_ * fVar27 + fVar22 + auVar13._0_4_ * fVar17;
  auVar15._4_4_ = auVar32._4_4_ * fVar14 + auVar29._4_4_ * fVar27 + fVar26 + auVar13._4_4_ * fVar17;
  auVar15._8_4_ = auVar32._8_4_ * fVar14 + auVar29._8_4_ * fVar27 + fVar43 + auVar13._8_4_ * fVar17;
  auVar15._12_4_ =
       auVar32._12_4_ * fVar14 + auVar29._12_4_ * fVar27 + fVar44 + auVar13._12_4_ * fVar17;
  local_128 = vmovlps_avx(auVar15);
  local_120 = vextractps_avx(auVar15,2);
  local_118 = local_58 * query->radius;
  local_88 = *(long *)&(pIVar4->super_Geometry).field_0x58;
  local_78 = context->query_ws;
  local_50 = context->userPtr;
  local_80 = 0;
  local_68._0_8_ = context->func;
  local_68._8_8_ = context->userContext;
  local_48 = 0xffffffffffffffff;
  fVar14 = local_78->radius;
  local_38._4_4_ = fVar14;
  local_38._0_4_ = fVar14;
  local_38._8_4_ = fVar14;
  local_38._12_4_ = fVar14;
  if (bVar7) {
    if (fVar14 < INFINITY) {
      lVar9 = vpextrq_avx(local_68,1);
      if (*(int *)(lVar9 + 0x88) != 0) {
        lVar11 = (ulong)(*(int *)(lVar9 + 0x88) - 1) * 0x40;
        pfVar1 = (float *)(lVar9 + lVar11);
        pfVar2 = (float *)(lVar9 + 0x10 + lVar11);
        pfVar3 = (float *)(lVar9 + 0x20 + lVar11);
        auVar32 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar11);
        auVar29 = vshufps_avx(local_38,local_38,0);
        fVar36 = -auVar29._0_4_;
        fVar22 = auVar29._4_4_;
        fVar39 = -auVar29._8_4_;
        fVar40 = -auVar29._12_4_;
        auVar31._0_4_ = auVar29._0_4_ * *pfVar3;
        auVar31._4_4_ = fVar22 * pfVar3[1];
        auVar31._8_4_ = auVar29._8_4_ * pfVar3[2];
        auVar31._12_4_ = auVar29._12_4_ * pfVar3[3];
        auVar15 = vsubps_avx(auVar32,auVar31);
        fVar41 = fVar36 * *pfVar2;
        fVar43 = -fVar22 * pfVar2[1];
        fVar44 = fVar39 * pfVar2[2];
        fVar45 = fVar40 * pfVar2[3];
        fVar46 = fVar41 + auVar15._0_4_;
        fVar47 = fVar43 + auVar15._4_4_;
        fVar48 = fVar44 + auVar15._8_4_;
        fVar49 = fVar45 + auVar15._12_4_;
        fVar36 = fVar36 * *pfVar1;
        fVar38 = -fVar22 * pfVar1[1];
        fVar39 = fVar39 * pfVar1[2];
        fVar40 = fVar40 * pfVar1[3];
        auVar29._0_4_ = fVar46 + fVar36;
        auVar29._4_4_ = fVar47 + fVar38;
        auVar29._8_4_ = fVar48 + fVar39;
        auVar29._12_4_ = fVar49 + fVar40;
        auVar51._8_4_ = 0x7f800000;
        auVar51._0_8_ = 0x7f8000007f800000;
        auVar51._12_4_ = 0x7f800000;
        auVar13 = vminps_avx(auVar51,auVar29);
        auVar52._8_4_ = 0xff800000;
        auVar52._0_8_ = 0xff800000ff800000;
        auVar52._12_4_ = 0xff800000;
        auVar29 = vmaxps_avx(auVar52,auVar29);
        fVar22 = fVar14 * *pfVar3 + auVar32._0_4_;
        fVar26 = fVar14 * pfVar3[1] + auVar32._4_4_;
        fVar27 = fVar14 * pfVar3[2] + auVar32._8_4_;
        fVar28 = fVar14 * pfVar3[3] + auVar32._12_4_;
        fVar41 = fVar41 + fVar22;
        fVar43 = fVar43 + fVar26;
        fVar44 = fVar44 + fVar27;
        fVar45 = fVar45 + fVar28;
        auVar32._0_4_ = fVar36 + fVar41;
        auVar32._4_4_ = fVar38 + fVar43;
        auVar32._8_4_ = fVar39 + fVar44;
        auVar32._12_4_ = fVar40 + fVar45;
        auVar13 = vminps_avx(auVar13,auVar32);
        auVar32 = vmaxps_avx(auVar29,auVar32);
        fVar17 = fVar14 * *pfVar2;
        fVar19 = fVar14 * pfVar2[1];
        fVar20 = fVar14 * pfVar2[2];
        fVar21 = fVar14 * pfVar2[3];
        fVar30 = fVar17 + auVar15._0_4_;
        fVar33 = fVar19 + auVar15._4_4_;
        fVar34 = fVar20 + auVar15._8_4_;
        fVar35 = fVar21 + auVar15._12_4_;
        auVar50._0_4_ = fVar36 + fVar30;
        auVar50._4_4_ = fVar38 + fVar33;
        auVar50._8_4_ = fVar39 + fVar34;
        auVar50._12_4_ = fVar40 + fVar35;
        auVar29 = vminps_avx(auVar13,auVar50);
        auVar32 = vmaxps_avx(auVar32,auVar50);
        fVar17 = fVar17 + fVar22;
        fVar19 = fVar19 + fVar26;
        fVar20 = fVar20 + fVar27;
        fVar21 = fVar21 + fVar28;
        auVar23._0_4_ = fVar36 + fVar17;
        auVar23._4_4_ = fVar38 + fVar19;
        auVar23._8_4_ = fVar39 + fVar20;
        auVar23._12_4_ = fVar40 + fVar21;
        auVar29 = vminps_avx(auVar29,auVar23);
        auVar32 = vmaxps_avx(auVar32,auVar23);
        fVar22 = fVar14 * *pfVar1;
        fVar26 = fVar14 * pfVar1[1];
        fVar27 = fVar14 * pfVar1[2];
        fVar14 = fVar14 * pfVar1[3];
        auVar16._0_4_ = fVar46 + fVar22;
        auVar16._4_4_ = fVar47 + fVar26;
        auVar16._8_4_ = fVar48 + fVar27;
        auVar16._12_4_ = fVar49 + fVar14;
        auVar29 = vminps_avx(auVar29,auVar16);
        auVar32 = vmaxps_avx(auVar32,auVar16);
        auVar24._0_4_ = fVar22 + fVar41;
        auVar24._4_4_ = fVar26 + fVar43;
        auVar24._8_4_ = fVar27 + fVar44;
        auVar24._12_4_ = fVar14 + fVar45;
        auVar29 = vminps_avx(auVar29,auVar24);
        auVar32 = vmaxps_avx(auVar32,auVar24);
        auVar25._0_4_ = fVar22 + fVar30;
        auVar25._4_4_ = fVar26 + fVar33;
        auVar25._8_4_ = fVar27 + fVar34;
        auVar25._12_4_ = fVar14 + fVar35;
        auVar29 = vminps_avx(auVar29,auVar25);
        auVar32 = vmaxps_avx(auVar32,auVar25);
        auVar13._0_4_ = fVar22 + fVar17;
        auVar13._4_4_ = fVar26 + fVar19;
        auVar13._8_4_ = fVar27 + fVar20;
        auVar13._12_4_ = fVar14 + fVar21;
        auVar29 = vminps_avx(auVar29,auVar13);
        auVar32 = vmaxps_avx(auVar32,auVar13);
        auVar32 = vsubps_avx(auVar32,auVar29);
        local_38._0_4_ = auVar32._0_4_ * 0.5;
        local_38._4_4_ = auVar32._4_4_ * 0.5;
        local_38._8_4_ = auVar32._8_4_ * 0.5;
        local_38._12_4_ = auVar32._12_4_ * 0.5;
      }
    }
  }
  else {
    local_38 = vshufps_avx(ZEXT416((uint)(local_58 * fVar14)),ZEXT416((uint)(local_58 * fVar14)),0);
  }
  local_70 = uVar12;
  uVar8 = (**(code **)(local_88 + 0x88))(local_88 + 0x58,&local_128);
  pRVar6 = context->userContext;
  uVar10 = pRVar6->instStackSize - 1;
  pRVar6->instStackSize = uVar10;
  pRVar6->instID[uVar10] = 0xffffffff;
  pRVar6->instPrimID[pRVar6->instStackSize] = 0xffffffff;
  return (bool)uVar8;
}

Assistant:

bool InstanceIntersector1::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World();
      const AffineSpace3fa world2local = instance->getWorld2Local();
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);
      assert((similtude && similarityScale > 0) || !similtude);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func,
          context->userContext,
          similarityScale,
          context->userPtr);

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }